

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

void __thiscall helics::EndpointInfo::clearQueue(EndpointInfo *this)

{
  unique_lock<std::shared_mutex> local_18;
  
  LOCK();
  (this->mAvailableMessages).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  local_18._M_device = &(this->message_queue).m_mutex;
  local_18._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_18);
  local_18._M_owns = true;
  std::
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::clear(&(this->message_queue).m_obj);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_18);
  return;
}

Assistant:

void EndpointInfo::clearQueue()
{
    mAvailableMessages.store(0);
    message_queue.lock()->clear();
}